

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat3 * dja::mat3::scale(mat3 *__return_storage_ptr__,vec3 *values)

{
  float_t m00;
  float_t m11;
  float_t *pfVar1;
  vec3 *values_local;
  
  pfVar1 = vec3::operator[](values,0);
  m00 = *pfVar1;
  pfVar1 = vec3::operator[](values,1);
  m11 = *pfVar1;
  pfVar1 = vec3::operator[](values,2);
  mat3(__return_storage_ptr__,m00,0.0,0.0,0.0,m11,0.0,0.0,0.0,*pfVar1);
  return __return_storage_ptr__;
}

Assistant:

mat3 mat3::scale(const vec3& values)
{
    return mat3(values[0], 0, 0,
                0, values[1], 0,
                0, 0, values[2]);
}